

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

uchar * cJSONUtils_strdup(uchar *string)

{
  size_t sVar1;
  uchar *copy;
  size_t length;
  uchar *string_local;
  
  sVar1 = strlen((char *)string);
  string_local = (uchar *)cJSON_malloc(sVar1 + 1);
  if (string_local == (uchar *)0x0) {
    string_local = (uchar *)0x0;
  }
  else {
    memcpy(string_local,string,sVar1 + 1);
  }
  return string_local;
}

Assistant:

static unsigned char* cJSONUtils_strdup(const unsigned char* const string)
{
    size_t length = 0;
    unsigned char *copy = NULL;

    length = strlen((const char*)string) + sizeof("");
    copy = (unsigned char*) cJSON_malloc(length);
    if (copy == NULL)
    {
        return NULL;
    }
    memcpy(copy, string, length);

    return copy;
}